

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<long>::AutoFill(TPZMatrix<long> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong in_XMM1_Qb;
  long val;
  long local_60;
  int local_54;
  long local_50;
  double local_48;
  ulong uStack_40;
  
  local_54 = symmetric;
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  for (lVar2 = 0; lVar2 < (this->super_TPZBaseMatrix).fRow; lVar2 = lVar2 + 1) {
    if (local_54 == 0) {
      lVar3 = 0;
      lVar5 = 0;
    }
    else {
      lVar3 = 0;
      for (lVar4 = 0; lVar5 = lVar2, lVar2 != lVar4; lVar4 = lVar4 + 1) {
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar4,lVar2);
        local_60 = CONCAT44(extraout_var,iVar1);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar4,&local_60);
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar2,lVar4);
        lVar3 = (long)((double)lVar3 + ABS((double)CONCAT44(extraout_var_00,iVar1)));
      }
    }
    for (; lVar4 = (this->super_TPZBaseMatrix).fCol, lVar5 < lVar4; lVar5 = lVar5 + 1) {
      local_50 = GetRandomVal(this);
      if (lVar2 != lVar5) {
        lVar3 = (long)((double)lVar3 + ABS((double)local_50));
      }
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,lVar2,lVar5,&local_50);
      if (iVar1 == 0) {
        Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
      }
    }
    if ((this->super_TPZBaseMatrix).fRow == lVar4) {
      local_48 = ABS((double)lVar3);
      uStack_40 = in_XMM1_Qb & 0x7fffffffffffffff;
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar2,lVar2);
      in_XMM1_Qb = uStack_40;
      if (ABS((double)CONCAT44(extraout_var_01,iVar1)) < local_48) {
        local_60 = lVar3 + 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar2,&local_60);
      }
      if ((lVar3 == 0) &&
         (iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar2,lVar2), CONCAT44(extraout_var_02,iVar1) == 0)) {
        local_60 = 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar2,&local_60);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}